

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL>::SmallVector
          (SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> *this,size_type capacity)

{
  size_type capacity_local;
  SmallVector<slang::syntax::RandCaseItemSyntax_*,_5UL> *this_local;
  
  SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::SmallVectorBase
            (&this->super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>,5);
  SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>::reserve
            (&this->super_SmallVectorBase<slang::syntax::RandCaseItemSyntax_*>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }